

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int is_put_or_delete_method(mg_connection *conn)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((conn != (mg_connection *)0x0) &&
     (__s1 = (conn->request_info).request_method, __s1 != (char *)0x0)) {
    iVar1 = strcmp(__s1,"PUT");
    uVar2 = 1;
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"DELETE");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"MKCOL");
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"PATCH");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"LOCK");
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1,"UNLOCK");
              if (iVar1 != 0) {
                iVar1 = strcmp(__s1,"PROPPATCH");
                if (iVar1 != 0) {
                  iVar1 = strcmp(__s1,"MOVE");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(__s1,"COPY");
                    uVar2 = (uint)(iVar1 == 0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int
is_put_or_delete_method(const struct mg_connection *conn)
{
	if (conn) {
		const char *s = conn->request_info.request_method;
		if (s != NULL) {
			/* PUT, DELETE, MKCOL, PATCH, LOCK, UNLOCK, PROPPATCH, MOVE, COPY */
			return (!strcmp(s, "PUT") || !strcmp(s, "DELETE")
			        || !strcmp(s, "MKCOL") || !strcmp(s, "PATCH")
			        || !strcmp(s, "LOCK") || !strcmp(s, "UNLOCK")
			        || !strcmp(s, "PROPPATCH") || !strcmp(s, "MOVE")
			        || !strcmp(s, "COPY"));
		}
	}
	return 0;
}